

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

void yaml_token_delete(yaml_token_t *token)

{
  yaml_char_t *pyVar1;
  
  if (token == (yaml_token_t *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x24a,"void yaml_token_delete(yaml_token_t *)");
  }
  switch(token->type) {
  case YAML_ALIAS_TOKEN:
  case YAML_ANCHOR_TOKEN:
  case YAML_SCALAR_TOKEN:
    pyVar1 = (token->data).tag.handle;
    break;
  default:
    if (token->type != YAML_TAG_DIRECTIVE_TOKEN) goto LAB_0010332a;
  case YAML_TAG_TOKEN:
    pyVar1 = (token->data).tag.handle;
    if (pyVar1 != (yaml_char_t *)0x0) {
      free(pyVar1);
    }
    pyVar1 = (token->data).tag.suffix;
  }
  if (pyVar1 != (yaml_char_t *)0x0) {
    free(pyVar1);
  }
LAB_0010332a:
  (token->end_mark).line = 0;
  (token->end_mark).column = 0;
  (token->start_mark).column = 0;
  (token->end_mark).index = 0;
  (token->start_mark).index = 0;
  (token->start_mark).line = 0;
  (token->data).tag.suffix = (yaml_char_t *)0x0;
  *(undefined8 *)((long)&token->data + 0x10) = 0;
  *(undefined8 *)token = 0;
  (token->data).tag.handle = (yaml_char_t *)0x0;
  return;
}

Assistant:

YAML_DECLARE(void)
yaml_token_delete(yaml_token_t *token)
{
    assert(token);  /* Non-NULL token object expected. */

    switch (token->type)
    {
        case YAML_TAG_DIRECTIVE_TOKEN:
            yaml_free(token->data.tag_directive.handle);
            yaml_free(token->data.tag_directive.prefix);
            break;

        case YAML_ALIAS_TOKEN:
            yaml_free(token->data.alias.value);
            break;

        case YAML_ANCHOR_TOKEN:
            yaml_free(token->data.anchor.value);
            break;

        case YAML_TAG_TOKEN:
            yaml_free(token->data.tag.handle);
            yaml_free(token->data.tag.suffix);
            break;

        case YAML_SCALAR_TOKEN:
            yaml_free(token->data.scalar.value);
            break;

        default:
            break;
    }

    memset(token, 0, sizeof(yaml_token_t));
}